

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase31::run(TestCase31 *this)

{
  Builder builder_00;
  Reader reader;
  Reader reader_00;
  Builder builder_01;
  PointerType PVar1;
  DebugExpression<bool> _kjCondition_1;
  Builder root;
  Orphan<capnproto_test::capnp::test::TestAllTypes> orphan;
  DebugExpression<bool> _kjCondition;
  MallocMessageBuilder builder;
  DebugComparison<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>_&,_std::nullptr_t>
  local_248;
  int local_220;
  StructBuilder local_218;
  OrphanBuilder local_1f0;
  PointerReader local_1d0;
  StructBuilder local_1b0;
  CapTableBuilder *in_stack_fffffffffffffe80;
  void *in_stack_fffffffffffffe88;
  WirePointer *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  SegmentReader *in_stack_fffffffffffffea0;
  CapTableReader *pCStack_158;
  void *local_150;
  WirePointer *pWStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  StructReader local_130;
  MallocMessageBuilder local_100;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_100,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_1d0,&local_100.super_MessageBuilder);
  local_248.op.content.ptr = (char *)local_1d0.pointer;
  local_248.left = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_1d0.segment;
  local_248.right = local_1d0.capTable;
  PointerBuilder::initStruct(&local_218,(PointerBuilder *)&local_248,(StructSize)0x140006);
  local_248.op.content.ptr = (char *)(local_218.pointers + 2);
  local_248.left = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_218.segment;
  local_248.right = local_218.capTable;
  PointerBuilder::initStruct
            ((StructBuilder *)&stack0xfffffffffffffe78,(PointerBuilder *)&local_248,
             (StructSize)0x140006);
  builder_01._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffe88;
  builder_01._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffe80;
  builder_01._builder.data = in_stack_fffffffffffffe90;
  builder_01._builder.pointers = (WirePointer *)in_stack_fffffffffffffe98;
  builder_01._builder._32_8_ = in_stack_fffffffffffffea0;
  initTestMessage(builder_01);
  local_248.op.content.ptr = (char *)(local_218.pointers + 2);
  local_248.left = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_218.segment;
  local_248.right = local_218.capTable;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_248);
  local_1d0.segment = (SegmentReader *)CONCAT71(local_1d0.segment._1_7_,PVar1 != NULL_);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x24,ERROR,"\"failed: expected \" \"root.hasStructField()\", _kjCondition",
               (char (*) [39])"failed: expected root.hasStructField()",
               (DebugExpression<bool> *)&local_1d0);
  }
  local_1d0.pointer = local_218.pointers + 2;
  local_1d0.segment = &(local_218.segment)->super_SegmentReader;
  local_1d0.capTable = &(local_218.capTable)->super_CapTableReader;
  PointerBuilder::disown((OrphanBuilder *)&local_248,(PointerBuilder *)&local_1d0);
  local_1f0.capTable = (CapTableBuilder *)local_248.op.content.ptr;
  local_1f0.location = (word *)local_248.op.content.size_;
  local_1f0.tag.content = (uint64_t)local_248.left;
  local_1f0.segment = (SegmentBuilder *)local_248.right;
  local_248.left =
       (Orphan<capnproto_test::capnp::test::TestAllTypes> *)
       CONCAT71(local_248.left._1_7_,(word *)local_248.op.content.size_ != (word *)0x0);
  if (((word *)local_248.op.content.size_ == (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x27,ERROR,"\"failed: expected \" \"!(orphan == nullptr)\", _kjCondition",
               (char (*) [38])"failed: expected !(orphan == nullptr)",
               (DebugExpression<bool> *)&local_248);
  }
  OrphanBuilder::asStructReader(&local_130,&local_1f0,(StructSize)0x140006);
  reader._reader.capTable = local_130.capTable;
  reader._reader.segment = local_130.segment;
  reader._reader.data = local_130.data;
  reader._reader.pointers = local_130.pointers;
  reader._reader.dataSize = local_130.dataSize;
  reader._reader.pointerCount = local_130.pointerCount;
  reader._reader._38_2_ = local_130._38_2_;
  reader._reader.nestingLimit = local_130.nestingLimit;
  reader._reader._44_4_ = local_130._44_4_;
  checkTestMessage(reader);
  OrphanBuilder::asStruct(&local_1b0,&local_1f0,(StructSize)0x140006);
  builder_00._builder.capTable = local_1b0.capTable;
  builder_00._builder.segment = local_1b0.segment;
  builder_00._builder.data = local_1b0.data;
  builder_00._builder.pointers = local_1b0.pointers;
  builder_00._builder.dataSize = local_1b0.dataSize;
  builder_00._builder.pointerCount = local_1b0.pointerCount;
  builder_00._builder._38_2_ = local_1b0._38_2_;
  checkTestMessage(builder_00);
  local_248.op.content.ptr = (char *)(local_218.pointers + 2);
  local_248.left = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_218.segment;
  local_248.right = local_218.capTable;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_248);
  local_1d0.segment = (SegmentReader *)CONCAT71(local_1d0.segment._1_7_,PVar1 == NULL_);
  if ((PVar1 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2b,ERROR,"\"failed: expected \" \"!(root.hasStructField())\", _kjCondition",
               (char (*) [42])"failed: expected !(root.hasStructField())",
               (DebugExpression<bool> *)&local_1d0);
  }
  local_248.op.content.ptr = (char *)(local_218.pointers + 2);
  local_248.left = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_218.segment;
  local_248.right = local_218.capTable;
  PointerBuilder::adopt((PointerBuilder *)&local_248,&local_1f0);
  local_248.result = local_1f0.location == (word *)0x0;
  local_248.right = (void *)0x0;
  local_248.op.content.ptr = " == ";
  local_248.op.content.size_ = (size_t)&DAT_00000005;
  if ((!local_248.result) && (kj::_::Debug::minSeverity < 3)) {
    local_248.left = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)&local_1f0;
    kj::_::Debug::
    log<char_const(&)[35],kj::_::DebugComparison<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>&,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2e,ERROR,"\"failed: expected \" \"orphan == nullptr\", _kjCondition",
               (char (*) [35])"failed: expected orphan == nullptr",&local_248);
  }
  local_248.op.content.ptr = (char *)(local_218.pointers + 2);
  local_248.left = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_218.segment;
  local_248.right = local_218.capTable;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_248);
  local_1d0.segment = (SegmentReader *)CONCAT71(local_1d0.segment._1_7_,PVar1 != NULL_);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2f,ERROR,"\"failed: expected \" \"root.hasStructField()\", _kjCondition",
               (char (*) [39])"failed: expected root.hasStructField()",
               (DebugExpression<bool> *)&local_1d0);
  }
  StructBuilder::asReader(&local_218);
  if ((ushort)local_248._36_2_ < 3) {
    local_220 = 0x7fffffff;
    local_1d0.capTable = (CapTableReader *)0x0;
    local_1d0.pointer = (WirePointer *)0x0;
    local_1d0.segment = (SegmentReader *)0x0;
  }
  else {
    local_1d0.pointer = (WirePointer *)(local_248.op.content.size_ + 0x10);
    local_1d0.capTable = (CapTableReader *)local_248.right;
    local_1d0.segment = (SegmentReader *)local_248.left;
  }
  local_1d0.nestingLimit = local_220;
  PointerReader::getStruct((StructReader *)&stack0xfffffffffffffea0,&local_1d0,(word *)0x0);
  reader_00._reader.capTable = pCStack_158;
  reader_00._reader.segment = in_stack_fffffffffffffea0;
  reader_00._reader.data = local_150;
  reader_00._reader.pointers = pWStack_148;
  reader_00._reader._32_8_ = local_140;
  reader_00._reader._40_8_ = uStack_138;
  checkTestMessage(reader_00);
  if (local_1f0.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_1f0);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_100);
  return;
}

Assistant:

TEST(Any, AnyPointer) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestAnyPointer>();

  initTestMessage(root.getAnyPointerField().initAs<TestAllTypes>());
  checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());
  checkTestMessage(root.asReader().getAnyPointerField().getAs<TestAllTypes>());

  root.getAnyPointerField().setAs<Text>("foo");
  EXPECT_EQ("foo", root.getAnyPointerField().getAs<Text>());
  EXPECT_EQ("foo", root.asReader().getAnyPointerField().getAs<Text>());

  root.getAnyPointerField().setAs<Data>(data("foo"));
  EXPECT_EQ(data("foo"), root.getAnyPointerField().getAs<Data>());
  EXPECT_EQ(data("foo"), root.asReader().getAnyPointerField().getAs<Data>());

  {
    root.getAnyPointerField().setAs<List<uint32_t>>({123, 456, 789});

    {
      List<uint32_t>::Builder list = root.getAnyPointerField().getAs<List<uint32_t>>();
      ASSERT_EQ(3u, list.size());
      EXPECT_EQ(123u, list[0]);
      EXPECT_EQ(456u, list[1]);
      EXPECT_EQ(789u, list[2]);
    }

    {
      List<uint32_t>::Reader list = root.asReader().getAnyPointerField().getAs<List<uint32_t>>();
      ASSERT_EQ(3u, list.size());
      EXPECT_EQ(123u, list[0]);
      EXPECT_EQ(456u, list[1]);
      EXPECT_EQ(789u, list[2]);
    }
  }

  {
    root.getAnyPointerField().setAs<List<Text>>({"foo", "bar"});

    {
      List<Text>::Builder list = root.getAnyPointerField().getAs<List<Text>>();
      ASSERT_EQ(2u, list.size());
      EXPECT_EQ("foo", list[0]);
      EXPECT_EQ("bar", list[1]);
    }

    {
      List<Text>::Reader list = root.asReader().getAnyPointerField().getAs<List<Text>>();
      ASSERT_EQ(2u, list.size());
      EXPECT_EQ("foo", list[0]);
      EXPECT_EQ("bar", list[1]);
    }
  }

  {
    {
      List<TestAllTypes>::Builder list = root.getAnyPointerField().initAs<List<TestAllTypes>>(2);
      ASSERT_EQ(2u, list.size());
      initTestMessage(list[0]);
    }

    {
      List<TestAllTypes>::Builder list = root.getAnyPointerField().getAs<List<TestAllTypes>>();
      ASSERT_EQ(2u, list.size());
      checkTestMessage(list[0]);
      checkTestMessageAllZero(list[1]);
    }

    {
      List<TestAllTypes>::Reader list =
          root.asReader().getAnyPointerField().getAs<List<TestAllTypes>>();
      ASSERT_EQ(2u, list.size());
      checkTestMessage(list[0]);
      checkTestMessageAllZero(list[1]);
    }
  }
}